

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sws.c
# Opt level: O0

void nn_sws_term(nn_sws *self)

{
  long in_RDI;
  nn_list *in_stack_00000010;
  
  if (*(int *)(in_RDI + 0x58) != 1) {
    nn_backtrace_print();
    fprintf(_stderr,"Assertion failed: %d == %s (%s:%d)\n",(ulong)*(uint *)(in_RDI + 0x58),
            "NN_SWS_STATE_IDLE",
            "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/vendor/nanomsg/src/transports/ws/sws.c"
            ,0xa7);
    fflush(_stderr);
    nn_err_abort();
  }
  nn_fsm_event_term((nn_fsm_event *)(in_RDI + 0x1818));
  nn_msg_term((nn_msg *)0x159c1b);
  nn_msg_array_term(in_stack_00000010);
  nn_pipebase_term((nn_pipebase *)0x159c3b);
  nn_ws_handshake_term((nn_ws_handshake *)0x159c48);
  nn_fsm_term((nn_fsm *)0x159c51);
  return;
}

Assistant:

void nn_sws_term (struct nn_sws *self)
{
    nn_assert_state (self, NN_SWS_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_msg_term (&self->outmsg);
    nn_msg_array_term (&self->inmsg_array);
    nn_pipebase_term (&self->pipebase);
    nn_ws_handshake_term (&self->handshaker);
    nn_fsm_term (&self->fsm);
}